

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_load_all(void)

{
  wchar_t w;
  wchar_t h;
  term_win *ptVar1;
  term *ptVar2;
  long *plVar3;
  ulong uVar4;
  term_win **pptVar5;
  ulong uVar6;
  reversed_save *tgt;
  long *p;
  
  w = Term->wid;
  h = Term->hgt;
  pptVar5 = &Term->mem;
  p = (long *)0x0;
  while (ptVar1 = *pptVar5, ptVar1 != (term_win *)0x0) {
    plVar3 = (long *)mem_alloc(0x10);
    *plVar3 = (long)ptVar1;
    plVar3[1] = (long)p;
    p = plVar3;
    pptVar5 = &ptVar1->next;
  }
  uVar6 = 0;
  if (L'\0' < h) {
    uVar6 = (ulong)(uint)h;
  }
  while (p != (long *)0x0) {
    plVar3 = (long *)p[1];
    term_win_copy(Term->scr,(term_win *)*p,w,h);
    mem_free(p);
    ptVar2 = Term;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      ptVar2->x1[uVar4] = 0;
      ptVar2->x2[uVar4] = w + L'\xffffffff';
    }
    ptVar2->y1 = 0;
    ptVar2->y2 = h + L'\xffffffff';
    Term_fresh();
    p = plVar3;
  }
  ptVar1 = Term->mem;
  if (ptVar1 != (term_win *)0x0) {
    Term->mem = ptVar1->next;
    term_win_nuke(ptVar1);
    mem_free(ptVar1);
  }
  Term->saved = Term->saved + 0xff;
  return 0;
}

Assistant:

errr Term_load_all(void)
{
	int w = Term->wid;
	int h = Term->hgt;
	struct reversed_save {
		term_win *saved_mem; struct reversed_save *next;
	} *reversed_list = NULL;
	struct term_win *cursor;

	for (cursor = Term->mem; cursor; cursor = cursor->next) {
		struct reversed_save *new_head = mem_alloc(sizeof(*new_head));

		new_head->saved_mem = cursor;
		new_head->next = reversed_list;
		reversed_list = new_head;
	}

	while (reversed_list) {
		struct reversed_save *tgt = reversed_list;
		int y;

		reversed_list = reversed_list->next;
		term_win_copy(Term->scr, tgt->saved_mem, w, h);
		mem_free(tgt);

		/* Assume change */
		for (y = 0; y < h; y++) {
			/* Assume change */
			Term->x1[y] = 0;
			Term->x2[y] = w - 1;
		}
		Term->y1 = 0;
		Term->y2 = h - 1;

		/* Force a redraw with those contents. */
		Term_fresh();
	}

	/* Drop the most recent save. */
	if (Term->mem) {
		cursor = Term->mem;
		Term->mem = Term->mem->next;
		term_win_nuke(cursor);
		mem_free(cursor);
	}
	Term->saved--;

	/* Success */
	return (0);
}